

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O2

string * __thiscall
vkt::(anonymous_namespace)::getShaderName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,ShaderType shaderType,
          size_t progNdx)

{
  char *pcVar1;
  ostream *poVar2;
  undefined4 in_register_00000014;
  ostringstream str;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  pcVar1 = glu::getShaderTypeName((ShaderType)this);
  std::operator<<((ostream *)local_190,pcVar1);
  if (CONCAT44(in_register_00000014,shaderType) != 0) {
    poVar2 = std::operator<<((ostream *)local_190,"_");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

string getShaderName (ShaderType shaderType, size_t progNdx)
{
	ostringstream str;
	str << glu::getShaderTypeName(shaderType);
	if (progNdx > 0)
		str << "_" << progNdx;
	return str.str();
}